

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::IdlNamer::NamespacedString
          (string *__return_storage_ptr__,IdlNamer *this,Namespace *ns,string *str)

{
  ulong uVar1;
  string local_68 [32];
  undefined1 local_48 [8];
  string ret;
  string *str_local;
  Namespace *ns_local;
  IdlNamer *this_local;
  
  ret.field_2._8_8_ = str;
  std::__cxx11::string::string((string *)local_48);
  if (ns != (Namespace *)0x0) {
    (*(this->super_Namer)._vptr_Namer[10])(local_68,this,ns);
    std::__cxx11::string::operator+=((string *)local_48,local_68);
    std::__cxx11::string::~string(local_68);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)local_48,(string *)&(this->super_Namer).config_.namespace_seperator);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ret.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedString(const struct Namespace *ns,
                               const std::string &str) const {
    std::string ret;
    if (ns != nullptr) { ret += Namespace(ns->components); }
    if (!ret.empty()) ret += config_.namespace_seperator;
    return ret + str;
  }